

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.cpp
# Opt level: O1

message_order * __thiscall FIX::DataDictionary::getTrailerOrderedFields(DataDictionary *this)

{
  int *order;
  undefined8 uVar1;
  atomic<long> *counter;
  ConfigError *this_00;
  ulong uVar2;
  _Alloc_hider local_40;
  undefined1 local_38 [24];
  
  if ((this->m_trailerOrder).m_groupOrder.m_buffer == (int *)0x0) {
    order = (this->m_trailerOrderedFields).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
    uVar2 = (long)(this->m_trailerOrderedFields).super__Vector_base<int,_std::allocator<int>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)order;
    if (uVar2 == 0) {
      this_00 = (ConfigError *)__cxa_allocate_exception(0x50);
      local_40._M_p = local_38 + 8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,"<Trailer> does not have a stored message order","");
      ConfigError::ConfigError(this_00,(string *)&local_40);
      __cxa_throw(this_00,&ConfigError::typeinfo,FIX::Exception::~Exception);
    }
    message_order::message_order((message_order *)&local_40,order,(int)(uVar2 >> 2));
    *(pointer *)&this->m_trailerOrder = local_40._M_p;
    shared_array<int>::operator=(&(this->m_trailerOrder).m_groupOrder,(shared_array<int> *)local_38)
    ;
    uVar1 = local_38._8_8_;
    (this->m_trailerOrder).m_largest = local_38._16_4_;
    if ((long *)local_38._8_8_ != (long *)0x0) {
      LOCK();
      *(long *)local_38._8_8_ = *(long *)local_38._8_8_ + -1;
      UNLOCK();
      if (*(long *)local_38._8_8_ == 0) {
        local_38._0_8_ = 0;
        local_38._8_8_ = (int *)0x0;
        if ((long *)uVar1 != (long *)0x0) {
          operator_delete__((void *)uVar1);
        }
      }
    }
  }
  return &this->m_trailerOrder;
}

Assistant:

EXCEPT(ConfigError) {
  if (m_trailerOrder) {
    return m_trailerOrder;
  }

  if (m_trailerOrderedFields.size() == 0) {
    throw ConfigError("<Trailer> does not have a stored message order");
  }

  return m_trailerOrder = message_order(m_trailerOrderedFields.data(), m_trailerOrderedFields.size());
}